

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

macro_t new_macro(c2m_ctx_t c2m_ctx,token_t id,VARR_token_t *params,VARR_token_t *replacement)

{
  ulong *puVar1;
  int iVar2;
  node_t_conflict el;
  macro_t __ptr;
  macro_t *res;
  ulong uVar3;
  char *extraout_RDX;
  node_t_conflict n;
  c2m_ctx_t c2m_ctx_00;
  ulong uVar4;
  pos_t pVar5;
  macro_t tab_m;
  macro_t local_30;
  
  el = (node_t_conflict)malloc(0x20);
  *(token_t *)el = id;
  ((pos_t *)&el->attr)->fname = (char *)params;
  (el->op_link).prev = (node_t)replacement;
  *(int *)&(el->op_link).next = 0;
  iVar2 = HTAB_macro_t_do((HTAB_macro_t *)c2m_ctx->env[0].__jmpbuf[0],(macro_t)el,HTAB_FIND,
                          &local_30);
  if (iVar2 != 0) {
    __assert_fail("!HTAB_DO (macro_t, macro_tab, m, HTAB_FIND, tab_m)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x824,"macro_t new_macro(c2m_ctx_t, token_t, VARR_token_t *, VARR_token_t *)");
  }
  c2m_ctx_00 = (c2m_ctx_t)c2m_ctx->env[0].__jmpbuf[0];
  res = &local_30;
  n = el;
  HTAB_macro_t_do((HTAB_macro_t *)c2m_ctx_00,(macro_t)el,HTAB_INSERT,res);
  puVar1 = (ulong *)c2m_ctx->env[0].__jmpbuf[1];
  __ptr = (macro_t)puVar1[2];
  if (__ptr != (macro_t)0x0) {
    uVar3 = *puVar1;
    uVar4 = uVar3 + 1;
    if (puVar1[1] < uVar4) {
      uVar4 = (uVar4 >> 1) + uVar4;
      __ptr = (macro_t)realloc(__ptr,uVar4 * 8);
      puVar1[2] = (ulong)__ptr;
      puVar1[1] = uVar4;
      uVar3 = *puVar1;
      uVar4 = uVar3 + 1;
    }
    *puVar1 = uVar4;
    (&__ptr->id)[uVar3] = (token_t)el;
    return __ptr;
  }
  new_macro_cold_1();
  pVar5 = get_node_pos((c2m_ctx_t)c2m_ctx_00->node_positions,(node_t_conflict)(ulong)n->uid);
  if (pVar5.lno < 0) {
    pVar5._8_8_ = res;
    pVar5.fname = extraout_RDX;
    set_node_pos(c2m_ctx_00,n,pVar5);
  }
  return (macro_t)n;
}

Assistant:

static macro_t new_macro (c2m_ctx_t c2m_ctx, token_t id, VARR (token_t) * params,
                          VARR (token_t) * replacement) {
  pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;
  macro_t tab_m, m = malloc (sizeof (struct macro));

  m->id = id;
  m->params = params;
  m->replacement = replacement;
  m->ignore_p = FALSE;
  assert (!HTAB_DO (macro_t, macro_tab, m, HTAB_FIND, tab_m));
  HTAB_DO (macro_t, macro_tab, m, HTAB_INSERT, tab_m);
  VARR_PUSH (macro_t, macros, m);
  return m;
}